

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O1

void __thiscall libnbt::NBTTagData<float>::setType(NBTTagData<float> *this)

{
  char *__s1;
  int iVar1;
  char cVar2;
  
  __s1 = _Init;
  cVar2 = '\x01';
  if (_Init != _get) {
    if (*_Init != '*') {
      iVar1 = strcmp(_Init,_get);
      if (iVar1 == 0) goto LAB_00104653;
    }
    cVar2 = '\x02';
    if (__s1 != _widen) {
      if (*__s1 != '*') {
        iVar1 = strcmp(__s1,_widen);
        if (iVar1 == 0) goto LAB_00104653;
      }
      cVar2 = '\x03';
      if (__s1 != _put) {
        if (*__s1 != '*') {
          iVar1 = strcmp(__s1,_put);
          if (iVar1 == 0) goto LAB_00104653;
        }
        cVar2 = '\x04';
        if (__s1 != ___gmon_start__) {
          if (*__s1 != '*') {
            iVar1 = strcmp(__s1,___gmon_start__);
            if (iVar1 == 0) goto LAB_00104653;
          }
          cVar2 = '\x05';
        }
      }
    }
  }
LAB_00104653:
  (this->super_NBTBase).type = cVar2;
  return;
}

Assistant:

void setType() {
            if (typeid(T) == typeid(int8_t)) {
                type = BYTE;
            } else if (typeid(T) == typeid(int16_t)) {
                type = SHORT;
            } else if (typeid(T) == typeid(int32_t)) {
                type = INT;
            } else if (typeid(T) == typeid(int64_t)) {
                type = LONG;
            } else if (typeid(T) == typeid(float)) {
                type = FLOAT;
            } else if (typeid(T) == typeid(double)) {
                type = DOUBLE;
            } else if (typeid(T) == typeid(std::string)) {
                type = STRING;
            } else {
                type = END;
            }
        }